

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zarray.h
# Opt level: O0

void zarray_destroy(zarray_t *za)

{
  zarray_t *za_local;
  
  if (za != (zarray_t *)0x0) {
    if (za->data != (char *)0x0) {
      free(za->data);
    }
    memset(za,0,0x18);
    free(za);
  }
  return;
}

Assistant:

static inline void zarray_destroy(zarray_t *za)
{
    if (za == NULL)
        return;

    if (za->data != NULL)
        free(za->data);
    memset(za, 0, sizeof(zarray_t));
    free(za);
}